

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractByteBuffer.cpp
# Opt level: O1

bufsize_t buf_util::roundupToUnit(bufsize_t size,bufsize_t unit)

{
  if (unit != 0) {
    return (size / unit + (ulong)((size / unit) * unit < size)) * unit;
  }
  puts("Invalid roundup unit!");
  return 0;
}

Assistant:

bufsize_t buf_util::roundupToUnit(bufsize_t size, bufsize_t unit)
{
    if (unit == 0) {
        printf("Invalid roundup unit!\n");
        return 0;
    }
    bufsize_t unitsNum = size / unit;
    bufsize_t roundDown = unitsNum * unit;
    if (roundDown < size) unitsNum ++;
    return unitsNum * unit;
}